

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O1

List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *
__thiscall
Js::Utf8SourceInfo::EnsureTopLevelFunctionInfoList(Utf8SourceInfo *this,Recycler *recycler)

{
  Type *addr;
  List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar1;
  
  addr = &this->topLevelFunctionInfoList;
  if ((this->topLevelFunctionInfoList).ptr ==
      (List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
      0x0) {
    pLVar1 = JsUtil::
             List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::New(recycler,4);
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pLVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  return addr->ptr;
}

Assistant:

JsUtil::List<FunctionInfo *, Recycler> *
    Utf8SourceInfo::EnsureTopLevelFunctionInfoList(Recycler * recycler)
    {
        if (this->topLevelFunctionInfoList == nullptr)
        {
            this->topLevelFunctionInfoList = JsUtil::List<FunctionInfo *, Recycler>::New(recycler);
        }
        return this->topLevelFunctionInfoList;
    }